

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_compr.c
# Opt level: O0

void beltCompr(u32 *h,u32 *X,void *stack)

{
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  u32 *buf;
  
  *in_RDX = *in_RDI ^ in_RDI[2];
  in_RDX[1] = in_RDI[1] ^ in_RDI[3];
  in_RDX[2] = *in_RDX;
  in_RDX[3] = in_RDX[1];
  beltBlockEncr2((u32 *)in_RDX,(u32 *)in_RSI);
  *in_RDX = in_RDX[2] ^ *in_RDX;
  in_RDX[1] = in_RDX[3] ^ in_RDX[1];
  in_RDX[4] = *in_RDI;
  in_RDX[5] = in_RDI[1];
  in_RDX[2] = in_RDI[2];
  in_RDX[3] = in_RDI[3];
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  beltBlockEncr2((u32 *)in_RDI,(u32 *)in_RDX);
  *in_RDI = *in_RSI ^ *in_RDI;
  in_RDI[1] = in_RSI[1] ^ in_RDI[1];
  in_RDX[2] = *in_RDX ^ 0xffffffffffffffff;
  in_RDX[3] = in_RDX[1] ^ 0xffffffffffffffff;
  in_RDI[2] = in_RSI[2];
  in_RDI[3] = in_RSI[3];
  beltBlockEncr2((u32 *)(in_RDI + 2),(u32 *)(in_RDX + 2));
  in_RDI[2] = in_RSI[2] ^ in_RDI[2];
  in_RDI[3] = in_RSI[3] ^ in_RDI[3];
  return;
}

Assistant:

void beltCompr(u32 h[8], const u32 X[8], void* stack)
{
	// [12]buf = [4]buf0 || [4]buf1 || [4]buf2
	u32* buf = (u32*)stack;
	// буферы не пересекаются?
	ASSERT(memIsDisjoint3(h, 32, X, 32, buf, 48));
	// buf0, buf1 <- h0 + h1
	beltBlockXor(buf, h, h + 4);
	beltBlockCopy(buf + 4, buf);
	// buf0 <- beltBlock(buf0, X) + buf1
	beltBlockEncr2(buf, X);
	beltBlockXor2(buf, buf + 4);
	// buf2 <- h0
	beltBlockCopy(buf + 8, h);
	// buf1 <- h1 [buf01 == K1]
	beltBlockCopy(buf + 4, h + 4);
	// h0 <- beltBlock(X0, buf01) + X0
	beltBlockCopy(h, X);
	beltBlockEncr2(h, buf);
	beltBlockXor2(h, X);
	// buf1 <- ~buf0 [buf12 == K2]
	beltBlockNeg(buf + 4, buf);
	// h1 <- beltBlock(X1, buf12) + X1
	beltBlockCopy(h + 4, X + 4);
	beltBlockEncr2(h + 4, buf + 4);
	beltBlockXor2(h + 4, X + 4);
}